

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

Interpolation __thiscall tinyusdz::GPrim::get_displayColorsInterpolation(GPrim *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  const_iterator cVar3;
  mapped_type *this_00;
  storage_t<tinyusdz::Interpolation> sVar4;
  key_type local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"primvars:displayColor","");
  cVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&(this->props)._M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  sVar4 = (storage_t<tinyusdz::Interpolation>)0x3;
  if ((_Rb_tree_header *)cVar3._M_node != &(this->props)._M_t._M_impl.super__Rb_tree_header) {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"primvars:displayColor","");
    this_00 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::at(&this->props,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Attribute::type_name_abi_cxx11_(&local_50,&this_00->_attrib);
    iVar2 = ::std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((iVar2 == 0) && ((this_00->_attrib)._metas.interpolation.has_value_ == true)) {
      sVar4 = (this_00->_attrib)._metas.interpolation.contained;
    }
  }
  return (Interpolation)sVar4;
}

Assistant:

Interpolation GPrim::get_displayColorsInterpolation() const {
  if (props.count("primvars:displayColor")) {
    const auto &prop = props.at("primvars:displayColor");
    if (prop.get_attribute().type_name() == "color3f[]") {
      if (prop.get_attribute().metas().interpolation) {
        return prop.get_attribute().metas().interpolation.value();
      }
    }
  }

  return Interpolation::Vertex;  // default 'vertex'
}